

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall TPZEqnArray<long_double>::BeginEquation(TPZEqnArray<long_double> *this,int eq)

{
  (*(this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqNumber,
             (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + 1);
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = eq;
  this->fNumEq = this->fNumEq + 1;
  return;
}

Assistant:

void TPZEqnArray<TVar>::BeginEquation(int eq) {
	fEqNumber.Push(eq);
	fNumEq++;
}